

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

void __thiscall amrex::Amr::FinalizeInit(Amr *this,Real strt_time,Real stop_time)

{
  uint uVar1;
  int iVar2;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var3;
  pointer pdVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer piVar7;
  ostream *poVar8;
  long lVar9;
  double dVar10;
  Print local_1a8;
  
  _Var3.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (((this->amr_level).
         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
  (**(code **)(*(long *)_Var3.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x68))
            (stop_time,
             _Var3.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
             super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
             *(undefined4 *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,
             this->sub_cycle,&this->n_cycle,
             &(this->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio,&this->dt_level);
  dVar10 = *(this->dt_level).super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  *(this->dt_min).super_vector<double,_std::allocator<double>_>.
   super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       dVar10;
  *(this->n_cycle).super_vector<int,_std::allocator<int>_>.
   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 1;
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
    bldFineLevels(this,strt_time);
  }
  uVar1 = *(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  if (0 < (int)uVar1) {
    pdVar4 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar5 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    pdVar6 = (this->dt_min).super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    lVar9 = 1;
    do {
      dVar10 = dVar10 / (double)piVar5[lVar9];
      pdVar4[lVar9] = dVar10;
      pdVar6[lVar9] = dVar10;
      lVar9 = lVar9 + 1;
    } while ((ulong)uVar1 + 1 != lVar9);
  }
  if (-1 < (int)uVar1) {
    lVar9 = -1;
    do {
      dVar10 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar9 + 1];
      (**(code **)(*(long *)(this->amr_level).
                            super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar9 + 1]._M_t.
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                  + 0xc0))(strt_time,dVar10,dVar10);
      iVar2 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar2);
    if (-1 < iVar2) {
      lVar9 = -1;
      do {
        (**(code **)(*(long *)(this->amr_level).
                              super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                              .
                              super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar9 + 1]._M_t.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                    + 0x98))();
        iVar2 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar2);
      if (-1 < iVar2) {
        piVar5 = (this->level_steps).super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        piVar7 = (this->level_count).super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        lVar9 = -1;
        do {
          piVar5[lVar9 + 1] = 0;
          piVar7[lVar9 + 1] = 0;
          iVar2 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
          lVar9 = lVar9 + 1;
        } while (lVar9 < iVar2);
        if (-1 < iVar2) {
          lVar9 = -1;
          do {
            (**(code **)(*(long *)(this->amr_level).
                                  super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                  .
                                  super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar9 + 1]._M_t.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        + 0xa0))(stop_time);
            lVar9 = lVar9 + 1;
          } while (lVar9 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
        }
      }
    }
  }
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    iVar2 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose;
    if (iVar2 < 2) {
      if (iVar2 == 1) {
        local_1a8.os = OutStream();
        local_1a8.rank = *(int *)(DAT_00816950 + -0x30);
        local_1a8.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8.ss);
        *(undefined8 *)(&local_1a8.field_0x18 + *(long *)(local_1a8._16_8_ + -0x18)) =
             *(undefined8 *)(local_1a8.os + *(long *)(*(long *)local_1a8.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8.ss,"INITIAL GRIDS \n",0xf);
        Print::~Print(&local_1a8);
        poVar8 = OutStream();
        AmrCore::printGridSummary
                  (&this->super_AmrCore,poVar8,0,
                   *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
    }
    else {
      local_1a8.os = OutStream();
      local_1a8.rank = *(int *)(DAT_00816950 + -0x30);
      local_1a8.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8.ss);
      *(undefined8 *)(&local_1a8.field_0x18 + *(long *)(local_1a8._16_8_ + -0x18)) =
           *(undefined8 *)(local_1a8.os + *(long *)(*(long *)local_1a8.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8.ss,"INITIAL GRIDS \n",0xf);
      Print::~Print(&local_1a8);
      poVar8 = OutStream();
      printGridInfo(this,poVar8,0,
                    *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
    }
  }
  if ((this->record_grid_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->gridlog,"INITIAL GRIDS \n",0xf);
    printGridInfo(this,(ostream *)&this->gridlog,0,
                  *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
  }
  return;
}

Assistant:

void
Amr::FinalizeInit (Real              strt_time,
                   Real              stop_time)
{
    BL_PROFILE("Amr::FinalizeInit()");
    //
    // Compute dt and set time levels of all grid data.
    //
    amr_level[0]->computeInitialDt(finest_level,
                                   sub_cycle,
                                   n_cycle,
                                   ref_ratio,
                                   dt_level,
                                   stop_time);
    //
    // The following was added for multifluid.
    //
    Real dt0   = dt_level[0];
    dt_min[0]  = dt_level[0];
    n_cycle[0] = 1;

    if (max_level > 0)
        bldFineLevels(strt_time);

    for (int lev = 1; lev <= finest_level; lev++)
    {
        dt0           /= n_cycle[lev];
        dt_level[lev]  = dt0;
        dt_min[lev]    = dt_level[lev];
    }

    for (int lev = 0; lev <= finest_level; lev++)
        amr_level[lev]->setTimeLevel(strt_time,dt_level[lev],dt_level[lev]);

    for (int lev = 0; lev <= finest_level; lev++)
        amr_level[lev]->post_regrid(0,finest_level);

    for (int lev = 0; lev <= finest_level; lev++)
    {
        level_steps[lev] = 0;
        level_count[lev] = 0;
    }

    //
    // Perform any special post_initialization operations.
    //
    for(int lev(0); lev <= finest_level; ++lev) {
      amr_level[lev]->post_init(stop_time);
    }

    if (ParallelDescriptor::IOProcessor())
    {
       if (verbose > 1)
       {
           amrex::Print() << "INITIAL GRIDS \n";
           printGridInfo(amrex::OutStream(),0,finest_level);
       }
       else if (verbose > 0)
       {
           amrex::Print() << "INITIAL GRIDS \n";
           printGridSummary(amrex::OutStream(),0,finest_level);
       }
    }

    if (record_grid_info && ParallelDescriptor::IOProcessor())
    {
        gridlog << "INITIAL GRIDS \n";
        printGridInfo(gridlog,0,finest_level);
    }

    BL_COMM_PROFILE_NAMETAG("Amr::initialInit BOTTOM");
}